

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

wrapper<c,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_c>_>_conflict4
 __thiscall
boost::ext::di::v1_3_0::core::
injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
::operator()(injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
             *this)

{
  __uniq_ptr_impl<i1,_std::default_delete<i1>_> in_RDI;
  dependency__<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *creatable_dept;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *dependency;
  __uniq_ptr_impl<i1,_std::default_delete<i1>_> this_00;
  undefined1 local_19;
  undefined1 *local_18;
  
  this_00._M_t.super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.
  super__Head_base<0UL,_i1_*,_false>._M_head_impl =
       in_RDI._M_t.super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.
       super__Head_base<0UL,_i1_*,_false>._M_head_impl;
  binder::operator()((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
                      *)in_RDI._M_t.super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.
                        super__Head_base<0UL,_i1_*,_false>._M_head_impl);
  local_18 = &local_19;
  scopes::deduce::
  scope<$_67::TEMPNAMEPLACEHOLDERVALUE()const::c,$_67::TEMPNAMEPLACEHOLDERVALUE()const::c>::
  operator()((scope<c,_c> *)
             this_00._M_t.super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.
             super__Head_base<0UL,_i1_*,_false>._M_head_impl,
             (provider<boost::ext::di::v1_3_0::aux::pair<c,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_fwd<c>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
              *)in_RDI._M_t.super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.
                super__Head_base<0UL,_i1_*,_false>._M_head_impl);
  return (unique<boost::ext::di::v1_3_0::scopes::unique,_c>_conflict5)
         (unique_ptr<i1,_std::default_delete<i1>_>)
         this_00._M_t.super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.
         super__Head_base<0UL,_i1_*,_false>._M_head_impl;
}

Assistant:

auto create_successful_impl__() const {
    auto&& dependency = binder::resolve<T, TName>((injector*)this);
    using dependency_t = typename aux::remove_reference<decltype(dependency)>::type;
    using ctor_t = typename type_traits::ctor_traits__<binder::resolve_template_t<injector, typename dependency_t::given>, T,
                                                       typename dependency_t::ctor>::type;
    using provider_t = successful::provider<ctor_t, injector>;
    auto& creatable_dept = static_cast<dependency__<dependency_t>&>(dependency);
    using wrapper_t = decltype(creatable_dept.template create<T, TName>(provider_t{this}));
    using create_t = referable_t<T, config, dependency__<dependency_t>>;
    return successful::wrapper<create_t, wrapper_t>{creatable_dept.template create<T, TName>(provider_t{this})};
  }